

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterDcStatAccess.cpp
# Opt level: O2

long __thiscall
bhf::ads::MasterDcStatAccess::RunCommand
          (MasterDcStatAccess *this,ECADS_IOFFS_MASTER_DC_STAT command)

{
  mapped_type *pmVar1;
  ostream *poVar2;
  long lVar3;
  initializer_list<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_206;
  less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT> local_205;
  ECADS_IOFFS_MASTER_DC_STAT command_local;
  ECADS_IOFFS_MASTER_DC_STAT local_200 [2];
  string local_1f8;
  map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  dcDiagNames;
  stringstream stream;
  ostream local_198 [24];
  pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158 [7];
  
  local_1f8._M_dataplus._M_p._0_4_ = 1;
  command_local = command;
  std::
  pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_const_char_(&)[11],_true>
            ((pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&stream,(ECADS_IOFFS_MASTER_DC_STAT *)&local_1f8,(char (*) [11])"Activating");
  local_200[1] = 0;
  std::
  pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_const_char_(&)[9],_true>
            (&local_180,local_200 + 1,(char (*) [9])"Clearing");
  local_200[0] = DEACTIVATE;
  std::
  pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_const_char_(&)[13],_true>
            (local_158,local_200,(char (*) [13])"Deactivating");
  __l._M_len = 3;
  __l._M_array = (iterator)&stream;
  std::
  map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&dcDiagNames,__l,&local_205,&local_206);
  lVar3 = 0x58;
  do {
    std::__cxx11::string::~string((string *)(&stream + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x20);
  lVar3 = AdsDevice::WriteReqEx(&this->device,0x2f,command_local,0,(void *)0x0);
  if (lVar3 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    pmVar1 = std::
             map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&dcDiagNames,&command_local);
    poVar2 = std::operator<<(local_198,(string *)pmVar1);
    poVar2 = std::operator<<(poVar2," DC diagnosis failed with 0x");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<long>((long)poVar2);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  std::
  _Rb_tree<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&dcDiagNames._M_t);
  return lVar3;
}

Assistant:

long MasterDcStatAccess::RunCommand(ECADS_IOFFS_MASTER_DC_STAT command) const
{
    const std::map<ECADS_IOFFS_MASTER_DC_STAT, std::string> dcDiagNames = {
        { ECADS_IOFFS_MASTER_DC_STAT::ACTIVATE, "Activating" },
        { ECADS_IOFFS_MASTER_DC_STAT::CLEAR, "Clearing" },
        { ECADS_IOFFS_MASTER_DC_STAT::DEACTIVATE, "Deactivating" },
    };

    const auto status = device.WriteReqEx(
        ECADS_IGRP_MASTER_DC_STAT,
        command,
        0,
        nullptr
        );

    if (status != ADSERR_NOERR) {
        LOG_ERROR(dcDiagNames.at(command) << " DC diagnosis failed with 0x" << std::hex << status);
        return status;
    }

    return status;
}